

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O2

void av1_mv_pred(AV1_COMP *cpi,MACROBLOCK *x,uint8_t *ref_y_buffer,int ref_y_stride,int ref_frame,
                BLOCK_SIZE block_size)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint8_t *puVar5;
  ushort uVar6;
  ushort uVar7;
  undefined1 auVar8 [13];
  uint5 uVar9;
  undefined1 auVar10 [13];
  bool bVar11;
  int *piVar12;
  int_mv iVar13;
  int_mv iVar14;
  uint uVar15;
  int iVar16;
  ushort uVar17;
  uint uVar18;
  int i;
  long lVar19;
  uint uVar20;
  uint uVar21;
  undefined1 uVar23;
  uint uVar22;
  uint uVar24;
  ushort uVar25;
  short sVar31;
  short sVar32;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar33 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  long lStack_90;
  MV_REFERENCE_FRAME ref_frames [2];
  MV pred_mv [3];
  
  ref_frames[0] = (MV_REFERENCE_FRAME)ref_frame;
  ref_frames[1] = -1;
  uVar21 = 0;
  iVar13 = av1_get_ref_mv_from_stack(0,ref_frames,0,&x->mbmi_ext);
  iVar14 = av1_get_ref_mv_from_stack(0,ref_frames,1,&x->mbmi_ext);
  pred_mv[0] = iVar13.as_mv;
  if (iVar13.as_int == iVar14.as_int) {
    lStack_90 = 1;
  }
  else {
    pred_mv[1] = iVar14.as_mv;
    lStack_90 = 2;
  }
  puVar5 = x->plane[0].src.buf;
  uVar20 = 0x7fffffff;
  bVar11 = false;
  auVar36 = _DAT_00465f10;
  for (lVar19 = 0; lStack_90 != lVar19; lVar19 = lVar19 + 1) {
    uVar15._0_1_ = (x->e_mbd).width;
    uVar15._1_1_ = (x->e_mbd).height;
    uVar15._2_2_ = *(undefined2 *)&(x->e_mbd).field_0x2076;
    uVar23 = (undefined1)((ushort)uVar15._2_2_ >> 8);
    auVar8[0xc] = uVar23;
    auVar8._0_12_ = ZEXT712(0);
    uVar9 = CONCAT32(auVar8._10_3_,(ushort)(byte)uVar15._2_2_);
    auVar10._5_8_ = 0;
    auVar10._0_5_ = uVar9;
    uVar1 = (x->e_mbd).mi_row;
    uVar3 = (x->e_mbd).mi_col;
    uVar2 = (cpi->common).mi_params.mi_rows;
    uVar4 = (cpi->common).mi_params.mi_cols;
    auVar33._0_4_ = (uVar2 - uVar1) * 0x20 + 0x20;
    auVar33._4_4_ = (uVar4 - uVar3) * 0x20 + 0x20;
    auVar33._8_8_ = 0;
    auVar26._0_4_ = (int)CONCAT72(SUB137(auVar10 << 0x40,6),(ushort)(byte)uVar15._1_1_) + uVar1;
    auVar26._4_4_ = (uVar15 & 0xff) + uVar3;
    auVar26._8_4_ = (int)uVar9;
    auVar26[0xc] = uVar23;
    auVar26._13_3_ = 0;
    auVar34._8_2_ = 0xffff;
    auVar34._0_8_ = 0xffffffffffffffff;
    auVar34._10_2_ = 0xffff;
    auVar34._12_2_ = 0xffff;
    auVar34._14_2_ = 0xffff;
    auVar26 = auVar26 ^ auVar34;
    auVar27._0_4_ = auVar26._0_4_ << 5;
    auVar27._4_4_ = auVar26._4_4_ << 5;
    auVar27._8_4_ = auVar26._8_4_ << 5;
    auVar27._12_4_ = auVar26._12_4_ << 5;
    auVar34 = pshuflw(in_XMM3,ZEXT416((uint)pred_mv[lVar19]),0x60);
    in_XMM3._0_4_ = auVar34._0_4_ >> 0x10;
    in_XMM3._4_4_ = auVar34._4_4_ >> 0x10;
    in_XMM3._8_4_ = auVar34._8_4_ >> 0x10;
    in_XMM3._12_4_ = auVar34._12_4_ >> 0x10;
    auVar28._0_4_ = -(uint)(in_XMM3._0_4_ < auVar27._0_4_);
    auVar28._4_4_ = -(uint)(in_XMM3._4_4_ < auVar27._4_4_);
    auVar28._8_4_ = -(uint)(in_XMM3._8_4_ < auVar27._8_4_);
    auVar28._12_4_ = -(uint)(in_XMM3._12_4_ < auVar27._12_4_);
    auVar35._0_4_ = -(uint)(in_XMM3._0_4_ < auVar33._0_4_);
    auVar35._4_4_ = -(uint)(in_XMM3._4_4_ < auVar33._4_4_);
    auVar35._8_4_ = -(uint)(in_XMM3._8_4_ < 0);
    auVar35._12_4_ = -(uint)(in_XMM3._12_4_ < 0);
    in_XMM3 = in_XMM3 & auVar35;
    auVar34 = ~auVar28 & (~auVar35 & auVar33 | in_XMM3) | auVar27 & auVar28;
    auVar28 = pshuflw(auVar27 & auVar28,auVar34,0xe8);
    uVar22 = (uint)auVar34._0_2_;
    uVar24 = (uint)auVar34._4_2_;
    uVar15 = -uVar22;
    if (0 < (int)uVar22) {
      uVar15 = uVar22;
    }
    uVar18 = -uVar24;
    if (0 < (int)uVar24) {
      uVar18 = uVar24;
    }
    if (uVar18 < uVar15) {
      uVar18 = uVar15;
    }
    pred_mv[lVar19] = auVar28._0_4_;
    uVar25 = auVar28._0_2_;
    uVar6 = auVar28._2_2_;
    if (uVar21 <= uVar18 >> 3) {
      uVar7 = -uVar25;
      if (0 < (short)uVar25) {
        uVar7 = uVar25;
      }
      uVar15 = CONCAT22(uVar6,uVar7);
      uVar17 = -uVar6;
      if (0 < (short)uVar6) {
        uVar17 = uVar6;
      }
      if (uVar17 < uVar7) {
        uVar17 = uVar7;
      }
      uVar21 = (uint)(uVar17 >> 3);
    }
    auVar29._0_2_ = -(ushort)(-1 < (short)uVar25);
    sVar31 = -(ushort)(-1 < auVar28._4_2_);
    sVar32 = -(ushort)(-1 < auVar28._6_2_);
    auVar29._8_8_ =
         (undefined8)
         (CONCAT64(CONCAT42(CONCAT22(sVar32,sVar32),sVar31),CONCAT22(sVar31,sVar32)) >> 0x10);
    auVar29._6_2_ = -(ushort)(-1 < (short)uVar6);
    auVar29._4_2_ = -(ushort)(-1 < (short)uVar6);
    auVar29._2_2_ = auVar29._0_2_;
    uVar22 = uVar22 + SUB164(auVar29 & auVar36,0) + 3;
    uVar24 = uVar24 + SUB164(auVar29 & auVar36,4) + 3;
    auVar30._0_4_ = -(uint)(-0x7ffffff9 < (int)(uVar22 ^ 0x80000000));
    auVar30._4_4_ = -(uint)(-0x7ffffff9 < (int)(uVar22 ^ 0x80000000));
    auVar30._8_4_ = -(uint)(-0x7ffffff9 < (int)(uVar24 ^ 0x80000000));
    auVar30._12_4_ = -(uint)(-0x7ffffff9 < (int)(uVar24 ^ 0x80000000));
    iVar16 = movmskpd(uVar15,auVar30);
    if ((iVar16 == 0) && (bVar11)) {
      bVar11 = true;
    }
    else {
      bVar11 = (bool)(bVar11 | iVar16 == 0);
      uVar15 = (*cpi->ppi->fn_ptr[block_size].sdf)
                         (puVar5,x->plane[0].src.stride,
                          ref_y_buffer + (((int)uVar22 >> 3) * ref_y_stride + ((int)uVar24 >> 3)),
                          ref_y_stride);
      auVar36 = _DAT_00465f10;
      if ((int)uVar15 < (int)uVar20) {
        uVar20 = uVar15;
      }
      piVar12 = x->pred_mv1_sad;
      if (lVar19 == 0) {
        piVar12 = x->pred_mv0_sad;
      }
      piVar12[ref_frame] = uVar15;
    }
  }
  x->max_mv_context[ref_frame] = uVar21;
  x->pred_mv_sad[ref_frame] = uVar20;
  return;
}

Assistant:

void av1_mv_pred(const AV1_COMP *cpi, MACROBLOCK *x, uint8_t *ref_y_buffer,
                 int ref_y_stride, int ref_frame, BLOCK_SIZE block_size) {
  const MV_REFERENCE_FRAME ref_frames[2] = { ref_frame, NONE_FRAME };
  const int_mv ref_mv =
      av1_get_ref_mv_from_stack(0, ref_frames, 0, &x->mbmi_ext);
  const int_mv ref_mv1 =
      av1_get_ref_mv_from_stack(0, ref_frames, 1, &x->mbmi_ext);
  MV pred_mv[MAX_MV_REF_CANDIDATES + 1];
  int num_mv_refs = 0;
  pred_mv[num_mv_refs++] = ref_mv.as_mv;
  if (ref_mv.as_int != ref_mv1.as_int) {
    pred_mv[num_mv_refs++] = ref_mv1.as_mv;
  }

  assert(num_mv_refs <= (int)(sizeof(pred_mv) / sizeof(pred_mv[0])));

  const uint8_t *const src_y_ptr = x->plane[0].src.buf;
  int zero_seen = 0;
  int best_sad = INT_MAX;
  int max_mv = 0;
  // Get the sad for each candidate reference mv.
  for (int i = 0; i < num_mv_refs; ++i) {
    MV *this_mv = &pred_mv[i];
    enc_clamp_mv(&cpi->common, &x->e_mbd, this_mv);

    const int fp_row = (this_mv->row + 3 + (this_mv->row >= 0)) >> 3;
    const int fp_col = (this_mv->col + 3 + (this_mv->col >= 0)) >> 3;
    max_mv = AOMMAX(max_mv, AOMMAX(abs(this_mv->row), abs(this_mv->col)) >> 3);

    if (fp_row == 0 && fp_col == 0 && zero_seen) continue;
    zero_seen |= (fp_row == 0 && fp_col == 0);

    const uint8_t *const ref_y_ptr =
        &ref_y_buffer[ref_y_stride * fp_row + fp_col];
    // Find sad for current vector.
    const int this_sad = cpi->ppi->fn_ptr[block_size].sdf(
        src_y_ptr, x->plane[0].src.stride, ref_y_ptr, ref_y_stride);
    // Note if it is the best so far.
    if (this_sad < best_sad) {
      best_sad = this_sad;
    }
    if (i == 0)
      x->pred_mv0_sad[ref_frame] = this_sad;
    else if (i == 1)
      x->pred_mv1_sad[ref_frame] = this_sad;
  }

  // Note the index of the mv that worked best in the reference list.
  x->max_mv_context[ref_frame] = max_mv;
  x->pred_mv_sad[ref_frame] = best_sad;
}